

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool __thiscall
ImGui::BeginChildEx(ImGui *this,char *name,ImGuiID id,ImVec2 *size_arg,bool border,
                   ImGuiWindowFlags flags)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow *window_00;
  ImVec2 IVar3;
  undefined1 auVar4 [16];
  ImGuiContext *pIVar5;
  bool bVar6;
  ImGuiID IVar7;
  ImGuiWindow *window;
  ImGuiContext *g;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float fVar8;
  float fVar9;
  int iVar10;
  int iVar11;
  char title [256];
  char local_138 [264];
  
  pIVar5 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  uVar1 = pIVar2->Flags;
  IVar3 = GetContentRegionMax();
  iVar10 = (int)in_XMM0_Da;
  iVar11 = (int)in_XMM1_Da;
  fVar8 = (float)iVar10;
  fVar9 = (float)iVar11;
  if ((iVar10 < 1) &&
     (fVar8 = (IVar3.x - ((pIVar2->DC).CursorPos.x - (pIVar2->Pos).x)) + fVar8, fVar8 <= 4.0)) {
    fVar8 = 4.0;
  }
  if ((fVar9 <= 0.0) &&
     (fVar9 = fVar9 + (IVar3.y - ((pIVar2->DC).CursorPos.y - (pIVar2->Pos).y)), fVar9 <= 4.0)) {
    fVar9 = 4.0;
  }
  IVar3.y = fVar9;
  IVar3.x = fVar8;
  (pIVar5->NextWindowData).SizeVal = IVar3;
  (pIVar5->NextWindowData).SizeCond = 1;
  IVar7 = (ImGuiID)name;
  if (this == (ImGui *)0x0) {
    ImFormatString(local_138,0x100,"%s/%08X",pIVar2->Name,(ulong)name & 0xffffffff);
  }
  else {
    ImFormatString(local_138,0x100,"%s/%s_%08X",pIVar2->Name,this,(ulong)name & 0xffffffff);
  }
  auVar4._4_4_ = -(uint)(iVar10 == 0);
  auVar4._0_4_ = -(uint)(iVar10 == 0);
  auVar4._8_4_ = -(uint)(iVar11 == 0);
  auVar4._12_4_ = -(uint)(iVar11 == 0);
  iVar10 = movmskpd((int)this,auVar4);
  fVar8 = (pIVar5->Style).ChildBorderSize;
  if ((char)id == '\0') {
    (pIVar5->Style).ChildBorderSize = 0.0;
  }
  bVar6 = Begin(local_138,(bool *)0x0,uVar1 & 4 | (uint)size_arg | 0x1000103);
  (pIVar5->Style).ChildBorderSize = fVar8;
  window_00 = pIVar5->CurrentWindow;
  window_00->ChildId = IVar7;
  window_00->AutoFitChildAxises = iVar10;
  if (window_00->BeginCount == 1) {
    (pIVar2->DC).CursorPos = window_00->Pos;
  }
  if (((((uint)size_arg >> 0x17 & 1) == 0) && (pIVar5->NavActivateId == IVar7)) &&
     (((window_00->DC).NavLayerActiveMask != 0 || ((window_00->DC).NavHasScroll == true)))) {
    FocusWindow(window_00);
    NavInitWindow(window_00,false);
    SetActiveID(IVar7 + 1,window_00);
    pIVar5->ActiveIdSource = ImGuiInputSource_Nav;
  }
  return bVar6;
}

Assistant:

static bool ImGui::BeginChildEx(const char* name, ImGuiID id, const ImVec2& size_arg, bool border, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;

    flags |= ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoResize|ImGuiWindowFlags_NoSavedSettings|ImGuiWindowFlags_ChildWindow;
    flags |= (parent_window->Flags & ImGuiWindowFlags_NoMove);  // Inherit the NoMove flag

    // Size
    const ImVec2 content_avail = GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    const int auto_fit_axises = ((size.x == 0.0f) ? (1 << ImGuiAxis_X) : 0x00) | ((size.y == 0.0f) ? (1 << ImGuiAxis_Y) : 0x00);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too much issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);
    SetNextWindowSize(size);

    // Build up name. If you need to append to a same child from multiple location in the ID stack, use BeginChild(ImGuiID id) with a stable value.
    char title[256];
    if (name)
        ImFormatString(title, IM_ARRAYSIZE(title), "%s/%s_%08X", parent_window->Name, name, id);
    else
        ImFormatString(title, IM_ARRAYSIZE(title), "%s/%08X", parent_window->Name, id);

    const float backup_border_size = g.Style.ChildBorderSize;
    if (!border)
        g.Style.ChildBorderSize = 0.0f;
    bool ret = Begin(title, NULL, flags);
    g.Style.ChildBorderSize = backup_border_size;

    ImGuiWindow* child_window = g.CurrentWindow;
    child_window->ChildId = id;
    child_window->AutoFitChildAxises = auto_fit_axises;

    // Set the cursor to handle case where the user called SetNextWindowPos()+BeginChild() manually.
    // While this is not really documented/defined, it seems that the expected thing to do.
    if (child_window->BeginCount == 1)
        parent_window->DC.CursorPos = child_window->Pos;

    // Process navigation-in immediately so NavInit can run on first frame
    if (g.NavActivateId == id && !(flags & ImGuiWindowFlags_NavFlattened) && (child_window->DC.NavLayerActiveMask != 0 || child_window->DC.NavHasScroll))
    {
        FocusWindow(child_window);
        NavInitWindow(child_window, false);
        SetActiveID(id+1, child_window); // Steal ActiveId with a dummy id so that key-press won't activate child item
        g.ActiveIdSource = ImGuiInputSource_Nav;
    }
    return ret;
}